

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_pcm_rb_data_source__on_read
                    (ma_data_source *pDataSource,void *pFramesOut,ma_uint64 frameCount,
                    ma_uint64 *pFramesRead)

{
  ulong uVar1;
  ulong *in_RCX;
  ma_pcm_rb *in_RDX;
  void *in_RDI;
  ma_uint64 framesToRead;
  ma_uint32 mappedFrameCount;
  void *pMappedBuffer;
  ma_uint64 totalFramesRead;
  ma_result result;
  ma_pcm_rb *pRB;
  ma_uint32 in_stack_ffffffffffffffb8;
  ma_format in_stack_ffffffffffffffbc;
  ma_uint32 *in_stack_ffffffffffffffc0;
  ma_pcm_rb *pRB_00;
  undefined4 in_stack_ffffffffffffffd0;
  ma_result in_stack_ffffffffffffffd4;
  
  for (pRB_00 = (ma_pcm_rb *)0x0; pRB_00 < in_RDX;
      pRB_00 = (ma_pcm_rb *)((long)&(pRB_00->ds).vtable + (ulong)in_stack_ffffffffffffffbc)) {
    uVar1 = (long)in_RDX - (long)pRB_00;
    if (0xffffffff < uVar1) {
      uVar1 = 0xffffffff;
    }
    in_stack_ffffffffffffffbc = (ma_format)uVar1;
    in_stack_ffffffffffffffd4 =
         ma_pcm_rb_acquire_read
                   (pRB_00,in_stack_ffffffffffffffc0,
                    (void **)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    if ((in_stack_ffffffffffffffd4 != MA_SUCCESS) ||
       (in_stack_ffffffffffffffbc == ma_format_unknown)) break;
    ma_offset_pcm_frames_ptr
              (pRB_00,(ma_uint64)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
               in_stack_ffffffffffffffb8);
    ma_copy_pcm_frames((void *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),pRB_00,
                       (ma_uint64)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
                       in_stack_ffffffffffffffb8);
    in_stack_ffffffffffffffd4 =
         ma_pcm_rb_commit_read
                   ((ma_pcm_rb *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                    (ma_uint32)(uVar1 >> 0x20));
    if (in_stack_ffffffffffffffd4 != MA_SUCCESS) break;
  }
  if (pRB_00 < in_RDX) {
    ma_offset_pcm_frames_ptr
              (pRB_00,(ma_uint64)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
               in_stack_ffffffffffffffb8);
    ma_silence_pcm_frames
              (in_RDI,CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               (ma_format)((ulong)pRB_00 >> 0x20),(ma_uint32)pRB_00);
    pRB_00 = in_RDX;
  }
  *in_RCX = (ulong)pRB_00;
  return MA_SUCCESS;
}

Assistant:

static ma_result ma_pcm_rb_data_source__on_read(ma_data_source* pDataSource, void* pFramesOut, ma_uint64 frameCount, ma_uint64* pFramesRead)
{
    /* Since there's no notion of an end, we don't ever want to return MA_AT_END here. But it is possible to return 0. */
    ma_pcm_rb* pRB = (ma_pcm_rb*)pDataSource;
    ma_result result;
    ma_uint64 totalFramesRead;

    MA_ASSERT(pRB != NULL);

    /* We need to run this in a loop since the ring buffer itself may loop. */
    totalFramesRead = 0;
    while (totalFramesRead < frameCount) {
        void* pMappedBuffer;
        ma_uint32 mappedFrameCount;
        ma_uint64 framesToRead = frameCount - totalFramesRead;
        if (framesToRead > 0xFFFFFFFF) {
            framesToRead = 0xFFFFFFFF;
        }

        mappedFrameCount = (ma_uint32)framesToRead;
        result = ma_pcm_rb_acquire_read(pRB, &mappedFrameCount, &pMappedBuffer);
        if (result != MA_SUCCESS) {
            break;
        }

        if (mappedFrameCount == 0) {
            break;  /* <-- End of ring buffer. */
        }

        ma_copy_pcm_frames(ma_offset_pcm_frames_ptr(pFramesOut, totalFramesRead, pRB->format, pRB->channels), pMappedBuffer, mappedFrameCount, pRB->format, pRB->channels);

        result = ma_pcm_rb_commit_read(pRB, mappedFrameCount);
        if (result != MA_SUCCESS) {
            break;
        }

        totalFramesRead += mappedFrameCount;
    }

    /*
    There is no notion of an "end" in a ring buffer. If we didn't have enough data to fill the requested frame
    count we'll need to pad with silence. If we don't do this, totalFramesRead might equal 0 which will result
    in the data source layer at a higher level translating this to MA_AT_END which is incorrect for a ring buffer.
    */
    if (totalFramesRead < frameCount) {
        ma_silence_pcm_frames(ma_offset_pcm_frames_ptr(pFramesOut, totalFramesRead, pRB->format, pRB->channels), (frameCount - totalFramesRead), pRB->format, pRB->channels);
        totalFramesRead = frameCount;
    }

    *pFramesRead = totalFramesRead;
    return MA_SUCCESS;
}